

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O1

MemoryRegionSection * iotlb_to_section_aarch64(CPUState *cpu,hwaddr index,MemTxAttrs attrs)

{
  uc_struct_conflict7 *puVar1;
  _func_int_CPUState_ptr_MemTxAttrs_conflict *p_Var2;
  uint uVar3;
  MemTxAttrs unaff_EBX;
  
  puVar1 = cpu->uc;
  p_Var2 = cpu->cc->asidx_from_attrs;
  if (p_Var2 == (_func_int_CPUState_ptr_MemTxAttrs_conflict *)0x0) {
    uVar3 = 0;
  }
  else {
    uVar3 = (*p_Var2)((CPUState_conflict *)cpu,unaff_EBX);
    if (((int)uVar3 < 0) || (cpu->num_ases <= (int)uVar3)) {
      __assert_fail("ret < cpu->num_ases && ret >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/include/hw/core/cpu.h"
                    ,0x1a5,"int cpu_asidx_from_attrs(CPUState *, MemTxAttrs)");
    }
  }
  return ((cpu->cpu_ases[uVar3].memory_dispatch)->map).sections +
         (~*(ulong *)&puVar1->init_target_page->mask & index);
}

Assistant:

MemoryRegionSection *iotlb_to_section(CPUState *cpu,
                                      hwaddr index, MemTxAttrs attrs)
{
#ifdef TARGET_ARM
    struct uc_struct *uc = cpu->uc;
#endif
    int asidx = cpu_asidx_from_attrs(cpu, attrs);
    CPUAddressSpace *cpuas = &cpu->cpu_ases[asidx];
    AddressSpaceDispatch *d = cpuas->memory_dispatch;
    MemoryRegionSection *sections = d->map.sections;

    return &sections[index & ~TARGET_PAGE_MASK];
}